

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_cast(lua_State *L)

{
  CType *d;
  CTState *cts;
  uint64_t uVar1;
  CTypeID CVar2;
  uint uVar3;
  TValue *o;
  void *pvVar4;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  CVar2 = ffi_checkctype(L,cts,(TValue *)0x0);
  d = cts->tab + CVar2;
  o = lj_lib_checkany(L,2);
  L->top = o + 1;
  if (((0xfffffff < d->info) && (uVar3 = d->info >> 0x1c, uVar3 != 2)) && (uVar3 != 5)) {
    lj_err_arg(L,1,LJ_ERR_FFI_INVTYPE);
  }
  if (((o->field_4).it >> 0xf != 0x1fff5) ||
     (CVar2 != *(ushort *)(((ulong)o->field_4 & 0x7fffffffffff) + 10))) {
    pvVar4 = lj_mem_newgco(cts->L,(ulong)d->size + 0x10);
    *(undefined1 *)((long)pvVar4 + 9) = 10;
    *(short *)((long)pvVar4 + 10) = (short)CVar2;
    lj_cconv_ct_tv(cts,d,(uint8_t *)((long)pvVar4 + 0x10),o,1);
    o->u64 = (ulong)pvVar4 | 0xfffa800000000000;
    uVar1 = (L->glref).ptr64;
    if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
      lj_gc_step(L);
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_cast)	LJLIB_REC(ffi_new)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *d = ctype_raw(cts, id);
  TValue *o = lj_lib_checkany(L, 2);
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  if (!(ctype_isnum(d->info) || ctype_isptr(d->info) || ctype_isenum(d->info)))
    lj_err_arg(L, 1, LJ_ERR_FFI_INVTYPE);
  if (!(tviscdata(o) && cdataV(o)->ctypeid == id)) {
    GCcdata *cd = lj_cdata_new(cts, id, d->size);
    lj_cconv_ct_tv(cts, d, cdataptr(cd), o, CCF_CAST);
    setcdataV(L, o, cd);
    lj_gc_check(L);
  }
  return 1;
}